

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  ImDrawCmd *pIVar6;
  long lVar7;
  ImVec4 *pIVar8;
  ImDrawCmd *__dest;
  int iVar9;
  int iVar10;
  void *pvVar11;
  
  lVar7 = (long)(this->_ClipRectStack).Size;
  pIVar8 = &GNullClipRect;
  if (lVar7 != 0) {
    pIVar8 = (this->_ClipRectStack).Data + lVar7 + -1;
  }
  fVar1 = pIVar8->x;
  fVar2 = pIVar8->z;
  lVar7 = (long)(this->_TextureIdStack).Size;
  if (lVar7 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = (this->_TextureIdStack).Data[lVar7 + -1];
  }
  if (fVar1 <= fVar2) {
    fVar3 = pIVar8->y;
    fVar4 = pIVar8->w;
    if (fVar3 <= fVar4) {
      iVar10 = (this->CmdBuffer).Size;
      iVar5 = (this->CmdBuffer).Capacity;
      if (iVar10 == iVar5) {
        iVar10 = iVar10 + 1;
        if (iVar5 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar5 / 2 + iVar5;
        }
        if (iVar10 < iVar9) {
          iVar10 = iVar9;
        }
        if (iVar5 < iVar10) {
          __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar10 * 0x30);
          pIVar6 = (this->CmdBuffer).Data;
          if (pIVar6 != (ImDrawCmd *)0x0) {
            memcpy(__dest,pIVar6,(long)(this->CmdBuffer).Size * 0x30);
          }
          ImGui::MemFree((this->CmdBuffer).Data);
          (this->CmdBuffer).Data = __dest;
          (this->CmdBuffer).Capacity = iVar10;
        }
      }
      pIVar6 = (this->CmdBuffer).Data;
      iVar10 = (this->CmdBuffer).Size;
      (this->CmdBuffer).Size = iVar10 + 1;
      pIVar6[iVar10].ElemCount = 0;
      pIVar6[iVar10].ClipRect.x = fVar1;
      pIVar6[iVar10].ClipRect.y = fVar3;
      pIVar6[iVar10].ClipRect.z = fVar2;
      pIVar6[iVar10].ClipRect.w = fVar4;
      pIVar6[iVar10].TextureId = pvVar11;
      pIVar6[iVar10].UserCallback = (ImDrawCallback)0x0;
      (&pIVar6[iVar10].UserCallback)[1] = (ImDrawCallback)0x0;
      return;
    }
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                ,0xa8,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}